

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

uint32_t __thiscall
basisu::basisu_frontend::refine_block_endpoints_given_selectors(basisu_frontend *this)

{
  cluster_subblock_etc_params_vec *this_00;
  color_rgba *obj;
  byte bVar1;
  uint uVar2;
  color_rgba cVar3;
  uint16_t uVar4;
  uint16_t packed_delta3;
  uint32_t uVar5;
  int iVar6;
  vec2U *pvVar7;
  endpoint_cluster_etc_params *peVar8;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar9;
  uint *puVar10;
  etc_block *peVar11;
  pixel_block *ppVar12;
  uchar *puVar13;
  undefined4 uVar14;
  ulong uVar15;
  int block_index;
  size_t sVar16;
  vector<unsigned_char> *this_01;
  long lVar17;
  basis_etc_quality bVar18;
  uint32_t uVar19;
  results *prVar20;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  bool results_valid [2];
  color_rgba colors [2];
  uint local_330;
  uint local_32c;
  uint32_t b [2];
  results cluster_optimizer_results [2];
  vector<basisu::color_rgba> subblock_colors [2];
  params cluster_optimizer_params;
  uint64_t cur_subblock_err [2];
  uint8_vec subblock_selectors [2];
  vector<unsigned_char> cluster_selectors [2];
  color_rgba unpacked_block_pixels [16];
  
  debug_printf("refine_block_endpoints_given_selectors\n");
  this_00 = &this->m_endpoint_cluster_etc_params;
  aVar21 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x1;
  for (sVar16 = 0; (long)sVar16 < (long)(int)this->m_total_blocks; sVar16 = sVar16 + 1) {
    pvVar7 = vector<basisu::vec2U>::operator[](&this->m_block_endpoint_clusters_indices,sVar16);
    peVar8 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (this_00,(ulong)pvVar7->m_comps[0]);
    unpacked_block_pixels[0].field_0 = (anon_union_4_2_6eba8969_for_color_rgba_0)((int)aVar21 + -1);
    vector<unsigned_int>::push_back(&peVar8->m_subblocks,(uint *)unpacked_block_pixels);
    peVar8 = vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (this_00,(ulong)pvVar7->m_comps[1]);
    unpacked_block_pixels[0].field_0 = aVar21;
    vector<unsigned_int>::push_back(&peVar8->m_subblocks,(uint *)unpacked_block_pixels);
    aVar21.m_comps = aVar21.m_comps + 2;
  }
  sVar16 = 0;
  local_32c = 0;
  local_330 = 0;
  do {
    if ((this->m_endpoint_cluster_etc_params).m_size <= sVar16) {
      if ((this->m_params).m_debug_stats != false) {
        debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n",
                     SUB84((double)(((float)local_330 * 100.0) / (float)local_32c),0));
      }
      return local_330;
    }
    paVar9 = (anon_union_4_2_6eba8969_for_color_rgba_0 *)
             vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[]
                       (this_00,sVar16);
    subblock_colors[1].m_p = (color_rgba *)0x0;
    subblock_colors[1].m_size = 0;
    subblock_colors[1].m_capacity = 0;
    subblock_colors[0].m_p = (color_rgba *)0x0;
    subblock_colors[0].m_size = 0;
    subblock_colors[0].m_capacity = 0;
    subblock_selectors[1].m_p = (uchar *)0x0;
    subblock_selectors[1].m_size = 0;
    subblock_selectors[1].m_capacity = 0;
    subblock_selectors[0].m_p = (uchar *)0x0;
    subblock_selectors[0].m_size = 0;
    subblock_selectors[0].m_capacity = 0;
    cur_subblock_err[0] = 0;
    cur_subblock_err[1] = 0;
    for (uVar25 = 0; uVar25 < (uint)paVar9[10]; uVar25 = uVar25 + 1) {
      puVar10 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)&paVar9[8].field_1,uVar25);
      uVar23 = *puVar10;
      uVar22 = (ulong)(uVar23 >> 1);
      peVar11 = vector<basisu::etc_block>::operator[](&this->m_encoded_blocks,uVar22);
      bVar1 = (peVar11->field_0).m_bytes[3];
      ppVar12 = vector<basisu::pixel_block>::operator[](&this->m_source_blocks,uVar22);
      unpack_etc1(peVar11,unpacked_block_pixels,false);
      bVar27 = (bVar1 & 2) == 0;
      uVar23 = uVar23 & 1;
      uVar22 = (ulong)(uVar23 << 4);
      for (lVar24 = 0; lVar24 != 8; lVar24 = lVar24 + 1) {
        uVar2 = *(uint *)((ulong)(uVar23 << 5) + 0x309af0 + lVar24 * 4);
        obj = ppVar12->m_pixels[0] + uVar2;
        vector<basisu::color_rgba>::push_back(subblock_colors + bVar27,obj);
        uVar5 = color_distance((this->m_params).m_perceptual,obj,unpacked_block_pixels + uVar2,false
                              );
        cur_subblock_err[bVar27] = cur_subblock_err[bVar27] + (ulong)uVar5;
        uVar5 = etc_block::get_selector
                          (peVar11,(uint)*(byte *)(uVar22 + 0x309a90 + lVar24 * 2),
                           (uint)*(byte *)(uVar22 + 0x309a91 + lVar24 * 2));
        cluster_optimizer_results[0].m_error =
             CONCAT71(cluster_optimizer_results[0].m_error._1_7_,(char)uVar5);
        vector<unsigned_char>::push_back
                  (subblock_selectors + bVar27,(uchar *)cluster_optimizer_results);
      }
    }
    results_valid[0] = false;
    results_valid[1] = false;
    cluster_optimizer_results[0].m_error = 0;
    cluster_optimizer_results[0].m_block_color_unscaled.field_0 =
         (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    cluster_optimizer_results[0].m_block_inten_table = 0;
    cluster_optimizer_results[0].m_n = 0;
    cluster_optimizer_results[0]._20_4_ = 0;
    cluster_optimizer_results[0].m_pSelectors = (uint8_t *)0x0;
    cluster_optimizer_results[0].m_block_color4 = false;
    cluster_optimizer_results[0]._33_7_ = 0;
    cluster_optimizer_results[1].m_error = 0;
    cluster_optimizer_results[1].m_block_color_unscaled.field_0 =
         (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    cluster_optimizer_results[1].m_block_inten_table = 0;
    cluster_optimizer_results[1].m_n = 0;
    cluster_optimizer_results[1]._20_4_ = 0;
    cluster_optimizer_results[1].m_pSelectors = (uint8_t *)0x0;
    cluster_optimizer_results[1].m_block_color4 = false;
    cluster_optimizer_results[1]._33_7_ = 0;
    cluster_selectors[1].m_p = (uchar *)0x0;
    cluster_selectors[1].m_size = 0;
    cluster_selectors[1].m_capacity = 0;
    cluster_selectors[0].m_p = (uchar *)0x0;
    cluster_selectors[0].m_size = 0;
    cluster_selectors[0].m_capacity = 0;
    prVar20 = cluster_optimizer_results;
    lVar26 = 0;
    for (lVar24 = 0; lVar24 != 0x20; lVar24 = lVar24 + 0x10) {
      uVar23 = *(uint *)((long)&subblock_colors[0].m_size + lVar24);
      if ((ulong)uVar23 != 0) {
        etc1_optimizer::etc1_optimizer((etc1_optimizer *)unpacked_block_pixels);
        etc1_optimizer::params::params(&cluster_optimizer_params);
        cluster_optimizer_params.m_num_src_pixels = uVar23;
        cluster_optimizer_params.m_pSrc_pixels =
             vector<basisu::color_rgba>::operator[]
                       ((vector<basisu::color_rgba> *)((long)&subblock_colors[0].m_p + lVar24),0);
        cluster_optimizer_params.m_use_color4 = SUB81(lVar26,0);
        cluster_optimizer_params.super_basis_etc1_pack_params.m_perceptual =
             (this->m_params).m_perceptual;
        cluster_optimizer_params.m_pForce_selectors =
             vector<unsigned_char>::operator[]
                       ((vector<unsigned_char> *)((long)&subblock_selectors[0].m_p + lVar24),0);
        cluster_optimizer_params.super_basis_etc1_pack_params.m_quality = cETCQualityUber;
        this_01 = (vector<unsigned_char> *)((long)&cluster_selectors[0].m_p + lVar24);
        vector<unsigned_char>::resize(this_01,(ulong)uVar23,false);
        prVar20->m_n = uVar23;
        puVar13 = vector<unsigned_char>::operator[](this_01,0);
        prVar20->m_pSelectors = puVar13;
        etc1_optimizer::init
                  ((etc1_optimizer *)unpacked_block_pixels,(EVP_PKEY_CTX *)&cluster_optimizer_params
                  );
        bVar27 = etc1_optimizer::compute((etc1_optimizer *)unpacked_block_pixels);
        if ((bVar27) && (prVar20->m_error < cur_subblock_err[lVar26])) {
          results_valid[lVar26] = true;
        }
        local_32c = (uVar23 >> 3) + local_32c;
        etc1_optimizer::~etc1_optimizer((etc1_optimizer *)unpacked_block_pixels);
      }
      lVar26 = lVar26 + 1;
      prVar20 = prVar20 + 1;
    }
    for (uVar25 = 0; uVar25 != 2; uVar25 = uVar25 + 1) {
      if (results_valid[uVar25] == true) {
        bVar1 = 1;
        for (iVar6 = 0; iVar6 != (uVar25 == 0) + 1; iVar6 = iVar6 + 1) {
          for (uVar22 = 0; uVar22 < (uint)paVar9[10]; uVar22 = uVar22 + 1) {
            puVar10 = vector<unsigned_int>::operator[]
                                ((vector<unsigned_int> *)&paVar9[8].field_1,uVar22);
            uVar23 = *puVar10;
            peVar11 = vector<basisu::etc_block>::operator[]
                                (&this->m_encoded_blocks,(ulong)(uVar23 >> 1));
            if (uVar25 == (((peVar11->field_0).m_bytes[3] & 2) == 0)) {
              uVar23 = uVar23 & 1;
              if (uVar25 == 0) {
                uVar4 = etc_block::get_base5_color(peVar11);
                packed_delta3 = etc_block::get_delta3_color(peVar11);
                etc_block::unpack_color5
                          ((uint32_t *)unpacked_block_pixels,(uint32_t *)&cluster_optimizer_params,b
                           ,uVar4,false);
                bVar27 = etc_block::unpack_color5
                                   ((uint32_t *)(unpacked_block_pixels + 1),
                                    (uint32_t *)
                                    &cluster_optimizer_params.super_basis_etc1_pack_params.
                                     m_perceptual,b + 1,uVar4,packed_delta3,false,0xff);
                if (!bVar27) {
                  __assert_fail("success",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_frontend.cpp"
                                ,0xb72,
                                "uint32_t basisu::basisu_frontend::refine_block_endpoints_given_selectors()"
                               );
                }
                uVar15 = (ulong)(uVar23 << 2);
                *(uint *)((long)&unpacked_block_pixels[0].field_0 + uVar15) =
                     (uint)(byte)cluster_optimizer_results[0].m_block_color_unscaled.field_0._0_1_;
                *(uint *)((long)cur_subblock_err + (uVar15 - 0x40)) =
                     (uint)(byte)cluster_optimizer_results[0].m_block_color_unscaled.field_0._1_1_;
                cVar3 = unpacked_block_pixels[0];
                aVar21 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                if ((uint)unpacked_block_pixels[0].field_0 < 0xff) {
                  aVar21 = unpacked_block_pixels[0].field_0;
                }
                *(uint *)((long)b + uVar15) =
                     (uint)(byte)cluster_optimizer_results[0].m_block_color_unscaled.field_0._2_1_;
                colors[0].field_0._0_1_ = aVar21.m_comps[0];
                if ((int)cVar3.field_0 < 0) {
                  colors[0].field_0._0_1_ = '\0';
                }
                bVar18 = 0xff;
                if (cluster_optimizer_params.super_basis_etc1_pack_params.m_quality < 0xff) {
                  bVar18 = cluster_optimizer_params.super_basis_etc1_pack_params.m_quality;
                }
                colors[0].field_0._1_1_ = (uint8_t)bVar18;
                if ((int)cluster_optimizer_params.super_basis_etc1_pack_params.m_quality < 0) {
                  colors[0].field_0._1_1_ = '\0';
                }
                uVar19 = 0xff;
                if (b[0] < 0xff) {
                  uVar19 = b[0];
                }
                colors[0].field_0._2_1_ = (undefined1)uVar19;
                if ((int)b[0] < 0) {
                  colors[0].field_0._2_1_ = '\0';
                }
                colors[0].field_0.m_comps[3] = 0xff;
                aVar21 = (anon_union_4_2_6eba8969_for_color_rgba_0)0xff;
                if ((uint)unpacked_block_pixels[1].field_0 < 0xff) {
                  aVar21 = unpacked_block_pixels[1].field_0;
                }
                colors[1].field_0._0_1_ = aVar21.m_comps[0];
                if ((int)unpacked_block_pixels[1].field_0 < 0) {
                  colors[1].field_0._0_1_ = '\0';
                }
                uVar14._0_1_ = true;
                uVar14._1_1_ = false;
                uVar14._2_1_ = false;
                uVar14._3_1_ = false;
                if ((uint)cluster_optimizer_params.super_basis_etc1_pack_params._4_4_ < 0xff) {
                  uVar14 = cluster_optimizer_params.super_basis_etc1_pack_params._4_4_;
                }
                colors[1].field_0._1_1_ = (undefined1)uVar14;
                if ((int)cluster_optimizer_params.super_basis_etc1_pack_params._4_4_ < 0) {
                  colors[1].field_0._1_1_ = '\0';
                }
                uVar19 = 0xff;
                if (b[1] < 0xff) {
                  uVar19 = b[1];
                }
                colors[1].field_0._2_1_ = (undefined1)uVar19;
                if ((int)b[1] < 0) {
                  colors[1].field_0._2_1_ = '\0';
                }
                colors[1].field_0.m_comps[3] = 0xff;
                bVar27 = etc_block::try_pack_color5_delta3(colors);
                if (!bVar27) {
                  bVar1 = 0;
                  break;
                }
                if (!(bool)(iVar6 == 1 & bVar1)) goto LAB_00228475;
                etc_block::set_block_color5(peVar11,colors,colors + 1);
                etc_block::set_inten_table
                          (peVar11,uVar23,cluster_optimizer_results[0].m_block_inten_table);
                *(uint64_t *)(paVar9 + 4) = cluster_optimizer_results[0].m_error;
                paVar9[2] = (anon_union_4_2_6eba8969_for_color_rgba_0)
                            cluster_optimizer_results[0].m_block_inten_table;
                paVar9->field_1 =
                     (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                     cluster_optimizer_results[0].m_block_color_unscaled.field_0;
              }
              else {
                uVar4 = etc_block::pack_color4
                                  (&cluster_optimizer_results[1].m_block_color_unscaled,false,0x7f);
                etc_block::set_base4_color(peVar11,uVar23,uVar4);
                etc_block::set_inten_table
                          (peVar11,uVar23,cluster_optimizer_results[1].m_block_inten_table);
                *(uint64_t *)(paVar9 + 6) = cluster_optimizer_results[1].m_error;
                paVar9[3] = (anon_union_4_2_6eba8969_for_color_rgba_0)
                            cluster_optimizer_results[1].m_block_inten_table;
                paVar9[1].field_1 =
                     (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                     cluster_optimizer_results[1].m_block_color_unscaled.field_0;
              }
              local_330 = local_330 + 1;
            }
LAB_00228475:
          }
        }
      }
    }
    lVar24 = 0x10;
    lVar26 = lVar24;
    do {
      vector<unsigned_char>::~vector
                ((vector<unsigned_char> *)((long)&cluster_selectors[0].m_p + lVar26));
      lVar26 = lVar26 + -0x10;
      lVar17 = lVar24;
    } while (lVar26 != -0x10);
    do {
      vector<unsigned_char>::~vector
                ((vector<unsigned_char> *)((long)&subblock_selectors[0].m_p + lVar17));
      lVar17 = lVar17 + -0x10;
    } while (lVar17 != -0x10);
    do {
      vector<basisu::color_rgba>::~vector
                ((vector<basisu::color_rgba> *)((long)&subblock_colors[0].m_p + lVar24));
      lVar24 = lVar24 + -0x10;
    } while (lVar24 != -0x10);
    sVar16 = sVar16 + 1;
  } while( true );
}

Assistant:

uint32_t basisu_frontend::refine_block_endpoints_given_selectors()
	{
		debug_printf("refine_block_endpoints_given_selectors\n");
				
		for (int block_index = 0; block_index < static_cast<int>(m_total_blocks); block_index++)
		{
			//uint32_t selector_cluster = m_block_selector_cluster_index(block_x, block_y);
			vec2U &endpoint_clusters = m_block_endpoint_clusters_indices[block_index];

			m_endpoint_cluster_etc_params[endpoint_clusters[0]].m_subblocks.push_back(block_index * 2);

			m_endpoint_cluster_etc_params[endpoint_clusters[1]].m_subblocks.push_back(block_index * 2 + 1);
		}

		uint32_t total_subblocks_refined = 0;
		uint32_t total_subblocks_examined = 0;

		for (uint32_t endpoint_cluster_index = 0; endpoint_cluster_index < m_endpoint_cluster_etc_params.size(); endpoint_cluster_index++)
		{
			endpoint_cluster_etc_params &subblock_params = m_endpoint_cluster_etc_params[endpoint_cluster_index];

			const uint_vec &subblocks = subblock_params.m_subblocks;
			//uint32_t total_pixels = subblock.m_subblocks.size() * 8;

			basisu::vector<color_rgba> subblock_colors[2]; // [use_individual_mode]
			uint8_vec subblock_selectors[2];

			uint64_t cur_subblock_err[2] = { 0, 0 };

			for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
			{
				uint32_t training_vector_index = subblocks[subblock_iter];

				uint32_t block_index = training_vector_index >> 1;
				uint32_t subblock_index = training_vector_index & 1;
				const bool is_flipped = true;

				const etc_block &blk = m_encoded_blocks[block_index];

				const bool use_individual_mode = !blk.get_diff_bit();

				const color_rgba *pSource_block_pixels = get_source_pixel_block(block_index).get_ptr();

				color_rgba unpacked_block_pixels[16];
				unpack_etc1(blk, unpacked_block_pixels);

				for (uint32_t i = 0; i < 8; i++)
				{
					const uint32_t pixel_index = g_etc1_pixel_indices[is_flipped][subblock_index][i];
					const etc_coord2 &coords = g_etc1_pixel_coords[is_flipped][subblock_index][i];

					subblock_colors[use_individual_mode].push_back(pSource_block_pixels[pixel_index]);

					cur_subblock_err[use_individual_mode] += color_distance(m_params.m_perceptual, pSource_block_pixels[pixel_index], unpacked_block_pixels[pixel_index], false);

					subblock_selectors[use_individual_mode].push_back(static_cast<uint8_t>(blk.get_selector(coords.m_x, coords.m_y)));
				}
			} // subblock_iter

			etc1_optimizer::results cluster_optimizer_results[2];
			bool results_valid[2] = { false, false };

			clear_obj(cluster_optimizer_results);

			basisu::vector<uint8_t> cluster_selectors[2];

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				const uint32_t total_pixels = (uint32_t)subblock_colors[use_individual_mode].size();

				if (!total_pixels)
					continue;

				total_subblocks_examined += total_pixels / 8;

				etc1_optimizer optimizer;
				etc1_solution_coordinates solutions[2];

				etc1_optimizer::params cluster_optimizer_params;
				cluster_optimizer_params.m_num_src_pixels = total_pixels;
				cluster_optimizer_params.m_pSrc_pixels = &subblock_colors[use_individual_mode][0];

				cluster_optimizer_params.m_use_color4 = use_individual_mode != 0;
				cluster_optimizer_params.m_perceptual = m_params.m_perceptual;

				cluster_optimizer_params.m_pForce_selectors = &subblock_selectors[use_individual_mode][0];
				cluster_optimizer_params.m_quality = cETCQualityUber;

				cluster_selectors[use_individual_mode].resize(total_pixels);

				cluster_optimizer_results[use_individual_mode].m_n = total_pixels;
				cluster_optimizer_results[use_individual_mode].m_pSelectors = &cluster_selectors[use_individual_mode][0];

				optimizer.init(cluster_optimizer_params, cluster_optimizer_results[use_individual_mode]);

				if (!optimizer.compute())
					continue;

				if (cluster_optimizer_results[use_individual_mode].m_error < cur_subblock_err[use_individual_mode])
					results_valid[use_individual_mode] = true;

			} // use_individual_mode

			for (uint32_t use_individual_mode = 0; use_individual_mode < 2; use_individual_mode++)
			{
				if (!results_valid[use_individual_mode])
					continue;

				uint32_t num_passes = use_individual_mode ? 1 : 2;

				bool all_passed5 = true;

				for (uint32_t pass = 0; pass < num_passes; pass++)
				{
					for (uint32_t subblock_iter = 0; subblock_iter < subblocks.size(); subblock_iter++)
					{
						const uint32_t training_vector_index = subblocks[subblock_iter];

						const uint32_t block_index = training_vector_index >> 1;
						const uint32_t subblock_index = training_vector_index & 1;
						//const bool is_flipped = true;

						etc_block &blk = m_encoded_blocks[block_index];

						if (!blk.get_diff_bit() != static_cast<bool>(use_individual_mode != 0))
							continue;

						if (use_individual_mode)
						{
							blk.set_base4_color(subblock_index, etc_block::pack_color4(cluster_optimizer_results[1].m_block_color_unscaled, false));
							blk.set_inten_table(subblock_index, cluster_optimizer_results[1].m_block_inten_table);

							subblock_params.m_color_error[1] = cluster_optimizer_results[1].m_error;
							subblock_params.m_inten_table[1] = cluster_optimizer_results[1].m_block_inten_table;
							subblock_params.m_color_unscaled[1] = cluster_optimizer_results[1].m_block_color_unscaled;

							total_subblocks_refined++;
						}
						else
						{
							const uint16_t base_color5 = blk.get_base5_color();
							const uint16_t delta_color3 = blk.get_delta3_color();

							uint32_t r[2], g[2], b[2];
							etc_block::unpack_color5(r[0], g[0], b[0], base_color5, false);
							bool success = etc_block::unpack_color5(r[1], g[1], b[1], base_color5, delta_color3, false);
							assert(success);
							BASISU_NOTE_UNUSED(success);

							r[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.r;
							g[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.g;
							b[subblock_index] = cluster_optimizer_results[0].m_block_color_unscaled.b;

							color_rgba colors[2] = { color_rgba(r[0], g[0], b[0], 255), color_rgba(r[1], g[1], b[1], 255) };

							if (!etc_block::try_pack_color5_delta3(colors))
							{
								all_passed5 = false;
								break;
							}

							if ((pass == 1) && (all_passed5))
							{
								blk.set_block_color5(colors[0], colors[1]);
								blk.set_inten_table(subblock_index, cluster_optimizer_results[0].m_block_inten_table);

								subblock_params.m_color_error[0] = cluster_optimizer_results[0].m_error;
								subblock_params.m_inten_table[0] = cluster_optimizer_results[0].m_block_inten_table;
								subblock_params.m_color_unscaled[0] = cluster_optimizer_results[0].m_block_color_unscaled;

								total_subblocks_refined++;
							}
						}

					} // subblock_iter

				} // pass

			} // use_individual_mode

		} // endpoint_cluster_index

		if (m_params.m_debug_stats)
			debug_printf("Total subblock endpoints refined: %u (%3.1f%%)\n", total_subblocks_refined, total_subblocks_refined * 100.0f / total_subblocks_examined);
				
		return total_subblocks_refined;
	}